

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O1

void CoreML::Specification::CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::TableStruct::
     Shutdown(void)

{
  if (DAT_00749ac0 == '\x01') {
    DAT_00749ac0 = '\0';
    (*(code *)*_SoundAnalysisPreprocessing_Vggish_default_instance_)();
  }
  if (DAT_00749ae8 == '\x01') {
    DAT_00749ae8 = 0;
    (*(code *)*_SoundAnalysisPreprocessing_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _SoundAnalysisPreprocessing_Vggish_default_instance_.Shutdown();
  _SoundAnalysisPreprocessing_default_instance_.Shutdown();
}